

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

bool __thiscall
Hospital::Id_Validate_for_fire
          (Hospital *this,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,string *id)

{
  bool bVar1;
  ostream *poVar2;
  string *this_00;
  char *pcVar3;
  Hospital *pHVar4;
  vector<Nurse,_std::allocator<Nurse>_> vStack_98;
  undefined1 local_80 [32];
  string id_1;
  
  if (id->_M_string_length == 8) {
    pHVar4 = (Hospital *)&stack0xffffffffffffffc0;
    std::__cxx11::string::string((string *)pHVar4,(string *)id);
    bVar1 = validate_String_Must_Be_Number(pHVar4,(string *)&stack0xffffffffffffffc0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    if (bVar1) {
      std::vector<Nurse,_std::allocator<Nurse>_>::vector(&vStack_98,All_Of_Nurses);
      pHVar4 = (Hospital *)local_80;
      std::__cxx11::string::string((string *)pHVar4,(string *)id);
      bVar1 = Existence_Of_Id_For_Nurses(pHVar4,&vStack_98,(string *)local_80);
      std::__cxx11::string::~string((string *)local_80);
      std::vector<Nurse,_std::allocator<Nurse>_>::~vector(&vStack_98);
      if (bVar1) {
        this_00 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string(this_00,(string *)id);
        __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      pcVar3 = "This id already not exists !!!";
    }
    else {
      pcVar3 = "Your id must consist of numbers !";
    }
  }
  else {
    pcVar3 = "Your id lenght must be equal to 8 !";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return false;
}

Assistant:

bool Hospital :: Id_Validate_for_fire(vector<Nurse> All_Of_Nurses,string id){
    try {
        if(id.length() != 8) {
            cout <<"Your id lenght must be equal to 8 !"<<endl;
            return false;
        }
        else if(!validate_String_Must_Be_Number(id)) {
            cout <<"Your id must consist of numbers !"<<endl;
            return false;
        }
        else if(! Existence_Of_Id_For_Nurses(All_Of_Nurses ,id)){
            cout << "This id already not exists !!!"<<endl;   ///add bool func to search in file and check existence of id
            return false;
        }
        else throw id;
    }
    catch(string id) {
        cout << "your id entered successfully ."<<endl;
        return true;
    }
}